

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Bitmask exprSelectUsage(WhereMaskSet *pMaskSet,Select *pS)

{
  ExprList *pEVar1;
  SrcList *pSVar2;
  Expr *p;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Bitmask BVar6;
  int iVar7;
  ulong uVar8;
  Bitmask BVar9;
  ExprList_item *pEVar10;
  long lVar11;
  long lVar12;
  
  if (pS == (Select *)0x0) {
    BVar9 = 0;
  }
  else {
    BVar9 = 0;
    do {
      pEVar1 = pS->pEList;
      pSVar2 = pS->pSrc;
      if ((pEVar1 == (ExprList *)0x0) || (iVar7 = pEVar1->nExpr, iVar7 < 1)) {
        uVar8 = 0;
      }
      else {
        pEVar10 = pEVar1->a;
        lVar11 = 0;
        uVar8 = 0;
        do {
          if (pEVar10->pExpr == (Expr *)0x0) {
            uVar3 = 0;
          }
          else {
            uVar3 = sqlite3WhereExprUsageNN(pMaskSet,pEVar10->pExpr);
            iVar7 = pEVar1->nExpr;
          }
          uVar8 = uVar8 | uVar3;
          lVar11 = lVar11 + 1;
          pEVar10 = pEVar10 + 1;
        } while (lVar11 < iVar7);
      }
      pEVar1 = pS->pGroupBy;
      if ((pEVar1 == (ExprList *)0x0) || (iVar7 = pEVar1->nExpr, iVar7 < 1)) {
        uVar3 = 0;
      }
      else {
        pEVar10 = pEVar1->a;
        lVar11 = 0;
        uVar3 = 0;
        do {
          if (pEVar10->pExpr == (Expr *)0x0) {
            uVar4 = 0;
          }
          else {
            uVar4 = sqlite3WhereExprUsageNN(pMaskSet,pEVar10->pExpr);
            iVar7 = pEVar1->nExpr;
          }
          uVar3 = uVar3 | uVar4;
          lVar11 = lVar11 + 1;
          pEVar10 = pEVar10 + 1;
        } while (lVar11 < iVar7);
      }
      pEVar1 = pS->pOrderBy;
      if ((pEVar1 == (ExprList *)0x0) || (iVar7 = pEVar1->nExpr, iVar7 < 1)) {
        uVar4 = 0;
      }
      else {
        pEVar10 = pEVar1->a;
        lVar11 = 0;
        uVar4 = 0;
        do {
          if (pEVar10->pExpr == (Expr *)0x0) {
            uVar5 = 0;
          }
          else {
            uVar5 = sqlite3WhereExprUsageNN(pMaskSet,pEVar10->pExpr);
            iVar7 = pEVar1->nExpr;
          }
          uVar4 = uVar4 | uVar5;
          lVar11 = lVar11 + 1;
          pEVar10 = pEVar10 + 1;
        } while (lVar11 < iVar7);
      }
      if (pS->pWhere == (Expr *)0x0) {
        BVar6 = 0;
      }
      else {
        BVar6 = sqlite3WhereExprUsageNN(pMaskSet,pS->pWhere);
      }
      if (pS->pHaving == (Expr *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = sqlite3WhereExprUsageNN(pMaskSet,pS->pHaving);
      }
      BVar9 = uVar8 | BVar9 | uVar3 | uVar4 | BVar6 | uVar5;
      if ((pSVar2 != (SrcList *)0x0) && (0 < pSVar2->nSrc)) {
        lVar11 = 0;
        do {
          BVar6 = exprSelectUsage(pMaskSet,pSVar2->a[lVar11].pSelect);
          p = pSVar2->a[lVar11].pOn;
          if (p == (Expr *)0x0) {
            uVar8 = 0;
          }
          else {
            uVar8 = sqlite3WhereExprUsageNN(pMaskSet,p);
          }
          BVar9 = BVar6 | BVar9 | uVar8;
          if ((pSVar2->a[lVar11].fg.field_0x1 & 4) != 0) {
            pEVar1 = pSVar2->a[lVar11].u1.pFuncArg;
            if ((pEVar1 == (ExprList *)0x0) || (iVar7 = pEVar1->nExpr, iVar7 < 1)) {
              uVar8 = 0;
            }
            else {
              pEVar10 = pEVar1->a;
              lVar12 = 0;
              uVar8 = 0;
              do {
                if (pEVar10->pExpr == (Expr *)0x0) {
                  uVar3 = 0;
                }
                else {
                  uVar3 = sqlite3WhereExprUsageNN(pMaskSet,pEVar10->pExpr);
                  iVar7 = pEVar1->nExpr;
                }
                uVar8 = uVar8 | uVar3;
                lVar12 = lVar12 + 1;
                pEVar10 = pEVar10 + 1;
              } while (lVar12 < iVar7);
            }
            BVar9 = BVar9 | uVar8;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < pSVar2->nSrc);
      }
      pS = pS->pPrior;
    } while (pS != (Select *)0x0);
  }
  return BVar9;
}

Assistant:

static Bitmask exprSelectUsage(WhereMaskSet *pMaskSet, Select *pS){
  Bitmask mask = 0;
  while( pS ){
    SrcList *pSrc = pS->pSrc;
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pEList);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pGroupBy);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pOrderBy);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pWhere);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pHaving);
    if( ALWAYS(pSrc!=0) ){
      int i;
      for(i=0; i<pSrc->nSrc; i++){
        mask |= exprSelectUsage(pMaskSet, pSrc->a[i].pSelect);
        mask |= sqlite3WhereExprUsage(pMaskSet, pSrc->a[i].pOn);
        if( pSrc->a[i].fg.isTabFunc ){
          mask |= sqlite3WhereExprListUsage(pMaskSet, pSrc->a[i].u1.pFuncArg);
        }
      }
    }
    pS = pS->pPrior;
  }
  return mask;
}